

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

bool el::base::utils::Utils::
     installCallback<el::base::DefaultLogDispatchCallback,std::shared_ptr<el::LogDispatchCallback>>
               (string *id,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
               *mapT)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator iVar4;
  DefaultLogDispatchCallback *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_58;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
          ::find(&mapT->_M_t,id);
  p_Var1 = &(mapT->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    __p = (DefaultLogDispatchCallback *)operator_new(0x18);
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)0x0;
    *(undefined8 *)
     &(__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
      field_0x8 = 0;
    __p->m_data = (LogDispatchData *)0x0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.field_0x9
         = 1;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00184330;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<el::base::DefaultLogDispatchCallback*>(&_Stack_60,__p);
    paVar2 = &local_58.first.field_2;
    pcVar3 = (id->_M_dataplus)._M_p;
    local_58.first._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + id->_M_string_length);
    local_58.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_60._M_pi;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)__p;
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>>
                *)mapT,&local_58);
    if (local_58.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58.second.
                 super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.first._M_dataplus._M_p,
                      local_58.first.field_2._M_allocated_capacity + 1);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
  }
  return (_Rb_tree_header *)iVar4._M_node == p_Var1;
}

Assistant:

static bool installCallback(const std::string& id, std::map<std::string, TPtr>* mapT) {
    if (mapT->find(id) == mapT->end()) {
      mapT->insert(std::make_pair(id, TPtr(new T())));
      return true;
    }
    return false;
  }